

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

p_ply_conflict
ply_create_to_file(FILE *fp,e_ply_storage_mode storage_mode,p_ply_error_cb error_cb,long idata,
                  void *pdata)

{
  uint uVar1;
  p_ply_conflict ptVar2;
  t_ply_odriver *ptVar3;
  
  ptVar2 = (p_ply_conflict)calloc(1,0x20f0);
  if (ptVar2 == (p_ply_conflict)0x0) {
    (*error_cb)((p_ply)0x0,"Out of memory");
  }
  else {
    ptVar2->idata = idata;
    ptVar2->pdata = pdata;
    ptVar2->io_mode = PLY_WRITE;
    uVar1 = storage_mode - PLY_LITTLE_ENDIAN;
    if (uVar1 < 3) {
      ptVar3 = (t_ply_odriver *)(&PTR_ply_odriver_binary_001790d0)[uVar1];
      storage_mode = *(e_ply_storage_mode *)(&DAT_0015c3c0 + (ulong)uVar1 * 4);
    }
    else {
      ptVar3 = &ply_odriver_binary_reverse;
    }
    ptVar2->odriver = ptVar3;
    ptVar2->storage_mode = storage_mode;
    ptVar2->fp = fp;
    ptVar2->error_cb = error_cb;
  }
  return ptVar2;
}

Assistant:

p_ply ply_create_to_file(FILE *fp, e_ply_storage_mode storage_mode,
        p_ply_error_cb error_cb, long idata, void *pdata) {
    p_ply ply;
    assert(fp && storage_mode <= PLY_DEFAULT);
    if (!ply_type_check()) {
        error_cb(NULL, "Incompatible type system");
        return NULL;
    }
    ply = ply_alloc();
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_WRITE;
    if (storage_mode == PLY_DEFAULT) storage_mode = ply_arch_endian();
    if (storage_mode == PLY_ASCII) ply->odriver = &ply_odriver_ascii;
    else if (storage_mode == ply_arch_endian())
        ply->odriver = &ply_odriver_binary;
    else ply->odriver = &ply_odriver_binary_reverse;
    ply->storage_mode = storage_mode;
    ply->fp = fp;
    ply->own_fp = 0;
    ply->error_cb = error_cb;
    return ply;
}